

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O0

bool __thiscall FMB::FiniteModelMultiSorted::evaluate(FiniteModelMultiSorted *this,Unit *unit)

{
  bool bVar1;
  Unit *in_RSI;
  Clause *unaff_retaddr;
  FormulaUnit *fu;
  Clause *clause;
  Formula *formula;
  FormulaUnit *in_stack_000000a8;
  bool in_stack_000000ff;
  FormulaUnit *in_stack_00000100;
  FiniteModelMultiSorted *in_stack_00000108;
  uint in_stack_0000024c;
  Formula *in_stack_00000250;
  FiniteModelMultiSorted *in_stack_00000258;
  Unit *in_stack_ffffffffffffffc8;
  
  bVar1 = Kernel::Unit::isClause(in_RSI);
  if (bVar1) {
    Kernel::Unit::asClause(in_RSI);
    Kernel::Formula::fromClause(unaff_retaddr);
  }
  else {
    Shell::Rectify::rectify(in_stack_00000100,in_stack_000000ff);
    Shell::SimplifyFalseTrue::simplify(in_stack_000000a8);
    Shell::Flattening::flatten(in_stack_000000a8);
    Kernel::Unit::getFormula(in_stack_ffffffffffffffc8);
  }
  partialEvaluate(in_stack_00000108,(Formula *)in_stack_00000100);
  Shell::SimplifyFalseTrue::simplify((Formula *)fu);
  bVar1 = evaluate(in_stack_00000258,in_stack_00000250,in_stack_0000024c);
  return bVar1;
}

Assistant:

bool FiniteModelMultiSorted::evaluate(Unit* unit)
{
  Formula* formula = 0;
  if(unit->isClause()){
    Clause* clause = unit->asClause();
    formula = Formula::fromClause(clause);
  }
  else{
    FormulaUnit* fu = static_cast<FormulaUnit*>(unit);
    fu = Rectify::rectify(fu);
    fu = SimplifyFalseTrue::simplify(fu);
    fu = Flattening::flatten(fu);
    formula = fu->getFormula();
  }

  formula = partialEvaluate(formula);
  formula = SimplifyFalseTrue::simplify(formula);
  return evaluate(formula);
}